

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

void learn_with_metrics(lda *l,single_learner *base,example *ec)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  features_value_index_iterator *this;
  ulong *puVar4;
  features_value_index_iterator *this_00;
  feature_value *pfVar5;
  reference pvVar6;
  int __c;
  undefined8 in_RDX;
  features_value_iterator *rhs;
  long in_RDI;
  example *unaff_retaddr;
  uint64_t idx;
  iterator *f;
  iterator __end3;
  iterator __begin3;
  features *__range3;
  features *fs;
  iterator __end2;
  iterator __begin2;
  example *__range2;
  uint64_t weight_mask;
  uint64_t stride_shift;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  example_predict *in_stack_ffffffffffffff70;
  features_value_iterator in_stack_ffffffffffffff80;
  features *in_stack_ffffffffffffff88;
  features_value_index_iterator local_70;
  features *local_60;
  features *local_58;
  iterator local_50;
  iterator local_40;
  undefined8 local_30;
  uint64_t local_28;
  ulong local_20;
  undefined8 local_18;
  long local_8;
  
  if (*(long *)(*(long *)(in_RDI + 0x188) + 0x350) == 0) {
    local_18 = in_RDX;
    local_8 = in_RDI;
    uVar2 = parameters::stride_shift
                      ((parameters *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_20 = (ulong)uVar2;
    local_28 = parameters::mask((parameters *)
                                CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_30 = local_18;
    local_40 = example_predict::begin(in_stack_ffffffffffffff70);
    local_50 = example_predict::end(in_stack_ffffffffffffff70);
    while (bVar1 = example_predict::iterator::operator!=(&local_40,&local_50), bVar1) {
      local_60 = example_predict::iterator::operator*(&local_40);
      local_58 = local_60;
      features::begin(in_stack_ffffffffffffff88);
      features::end(in_stack_ffffffffffffff88);
      while( true ) {
        rhs = (features_value_iterator *)&stack0xffffffffffffff80;
        bVar1 = features_value_iterator::operator!=(&local_70.super_features_value_iterator,rhs);
        if (!bVar1) break;
        this = features_value_index_iterator::operator*(&local_70);
        puVar4 = (ulong *)features_value_index_iterator::index(this,(char *)rhs,__c);
        this_00 = (features_value_index_iterator *)((*puVar4 & local_28) >> ((byte)local_20 & 0x3f))
        ;
        pfVar5 = features_value_iterator::value(&this->super_features_value_iterator);
        iVar3 = (int)(long)*pfVar5;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_8 + 0x148)
                            ,(size_type)this_00);
        *pvVar6 = iVar3 + *pvVar6;
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)(local_8 + 0x160),(size_type)this_00);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_ffffffffffffff80._begin,(value_type_conflict3 *)this);
        features_value_index_iterator::operator++(this_00);
      }
      example_predict::iterator::operator++(&local_40);
    }
  }
  learn((lda *)f,(single_learner *)idx,unaff_retaddr);
  return;
}

Assistant:

void learn_with_metrics(lda &l, LEARNER::single_learner &base, example &ec)
{
  if (l.all->passes_complete == 0)
  {
    // build feature to example map
    uint64_t stride_shift = l.all->weights.stride_shift();
    uint64_t weight_mask = l.all->weights.mask();

    for (features &fs : ec)
    {
      for (features::iterator &f : fs)
      {
        uint64_t idx = (f.index() & weight_mask) >> stride_shift;
        l.feature_counts[idx] += (uint32_t)f.value();
        l.feature_to_example_map[idx].push_back(ec.example_counter);
      }
    }
  }

  learn(l, base, ec);
}